

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::testRunEnded(ConsoleReporter *this,TestRunStats *_testRunStats)

{
  ostream *stream;
  ColourImpl *streamColour;
  
  printTotalsDivider(this,&_testRunStats->totals);
  stream = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  streamColour = Detail::unique_ptr<Catch::ColourImpl>::operator*
                           (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
  printTestRunTotals(stream,streamColour,&_testRunStats->totals);
  std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  std::ostream::flush();
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  return;
}

Assistant:

void ConsoleReporter::testRunEnded(TestRunStats const& _testRunStats) {
    printTotalsDivider(_testRunStats.totals);
    printTestRunTotals( m_stream, *m_colour, _testRunStats.totals );
    m_stream << '\n' << std::flush;
    StreamingReporterBase::testRunEnded(_testRunStats);
}